

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

void * stbi__jpeg_load(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri)

{
  anon_struct_96_18_0d0905d3 *paVar1;
  byte bVar2;
  stbi_uc sVar3;
  short sVar4;
  short sVar5;
  bool bVar6;
  int *piVar7;
  byte bVar8;
  uchar uVar9;
  short sVar10;
  int iVar11;
  stbi__uint32 sVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  stbi__jpeg *z;
  char *pcVar16;
  long lVar17;
  void *pvVar18;
  code *pcVar19;
  void *pvVar20;
  undefined8 *puVar21;
  int iVar22;
  uint uVar23;
  long lVar24;
  undefined8 *puVar25;
  uint extraout_EDX;
  uint extraout_EDX_00;
  uint uVar26;
  uint uVar27;
  uint extraout_EDX_01;
  uint extraout_EDX_02;
  int why;
  int why_00;
  undefined8 extraout_RDX;
  undefined8 uVar28;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  anon_struct_96_18_0d0905d3 *extraout_RDX_03;
  anon_struct_96_18_0d0905d3 *extraout_RDX_04;
  anon_struct_96_18_0d0905d3 *paVar29;
  ulong extraout_RDX_05;
  ulong extraout_RDX_06;
  ulong extraout_RDX_07;
  ulong extraout_RDX_08;
  ulong extraout_RDX_09;
  ulong extraout_RDX_10;
  ulong extraout_RDX_11;
  ulong extraout_RDX_12;
  undefined8 extraout_RDX_13;
  undefined8 extraout_RDX_14;
  stbi_uc *extraout_RDX_15;
  stbi_uc *extraout_RDX_16;
  stbi_uc *psVar30;
  stbi_uc **ppsVar31;
  undefined1 *puVar32;
  byte *pbVar33;
  stbi__context *psVar34;
  ulong uVar35;
  uint uVar36;
  long lVar37;
  stbi_uc *psVar38;
  ulong uVar39;
  int iVar40;
  uint uVar41;
  int iVar42;
  short *psVar43;
  long in_FS_OFFSET;
  bool bVar44;
  undefined1 auVar45 [16];
  stbi_uc *coutput [4];
  short data [64];
  int local_1bc;
  ulong local_188;
  stbi_uc *local_158 [5];
  anon_struct_96_18_0d0905d3 *local_130;
  int local_128;
  int local_124;
  int *local_120;
  stbi__uint32 *local_118;
  int *local_110;
  long local_108;
  stbi__uint32 *local_100;
  short local_f8 [4];
  long local_f0 [2];
  int local_e0 [44];
  
  local_100 = (stbi__uint32 *)x;
  z = (stbi__jpeg *)malloc(0x4888);
  if (z == (stbi__jpeg *)0x0) {
    *(char **)(in_FS_OFFSET + -0x20) = "outofmem";
    return (void *)0x0;
  }
  memset(z,0,0x4888);
  z->s = s;
  z->idct_block_kernel = stbi__idct_simd;
  z->YCbCr_to_RGB_kernel = stbi__YCbCr_to_RGB_simd;
  z->resample_row_hv_2_kernel = stbi__resample_row_hv_2_simd;
  s->img_n = 0;
  if ((uint)req_comp < 5) {
    paVar1 = z->img_comp;
    lVar17 = 0x46d8;
    do {
      psVar30 = z->huff_dc[0].fast + lVar17 + -8;
      psVar30[0] = '\0';
      psVar30[1] = '\0';
      psVar30[2] = '\0';
      psVar30[3] = '\0';
      psVar30[4] = '\0';
      psVar30[5] = '\0';
      psVar30[6] = '\0';
      psVar30[7] = '\0';
      psVar30[8] = '\0';
      psVar30[9] = '\0';
      psVar30[10] = '\0';
      psVar30[0xb] = '\0';
      psVar30[0xc] = '\0';
      psVar30[0xd] = '\0';
      psVar30[0xe] = '\0';
      psVar30[0xf] = '\0';
      lVar17 = lVar17 + 0x60;
    } while (lVar17 != 0x4858);
    z->restart_interval = 0;
    local_118 = (stbi__uint32 *)y;
    local_110 = comp;
    iVar11 = stbi__decode_jpeg_header(z,0);
    uVar23 = extraout_EDX;
    if (iVar11 == 0) {
LAB_0011e38f:
      uVar36 = z->s->img_n;
    }
    else {
      bVar8 = stbi__get_marker(z);
      uVar36 = (uint)bVar8;
      local_120 = z->huff_ac[0].delta + 9;
      uVar28 = extraout_RDX;
LAB_0011c449:
      uVar23 = (uint)uVar28;
      if (uVar36 == 0xda) {
        iVar11 = stbi__get16be(z->s);
        psVar34 = z->s;
        pbVar33 = psVar34->img_buffer;
        paVar29 = extraout_RDX_03;
        if (pbVar33 < psVar34->img_buffer_end) {
LAB_0011c4fd:
          psVar34->img_buffer = pbVar33 + 1;
          bVar8 = *pbVar33;
        }
        else {
          if (psVar34->read_from_callbacks != 0) {
            stbi__refill_buffer(psVar34);
            pbVar33 = psVar34->img_buffer;
            paVar29 = extraout_RDX_04;
            goto LAB_0011c4fd;
          }
          bVar8 = 0;
        }
        z->scan_n = (uint)bVar8;
        if ((0xfb < (byte)(bVar8 - 5)) && ((int)(uint)bVar8 <= z->s->img_n)) {
          if (iVar11 != (uint)bVar8 * 2 + 6) {
            pcVar16 = "bad SOS len";
            goto LAB_0011e386;
          }
          if (bVar8 != 0) {
            lVar17 = 0;
            do {
              psVar34 = z->s;
              pbVar33 = psVar34->img_buffer;
              if (pbVar33 < psVar34->img_buffer_end) {
LAB_0011c576:
                psVar34->img_buffer = pbVar33 + 1;
                uVar36 = (uint)*pbVar33;
              }
              else {
                if (psVar34->read_from_callbacks != 0) {
                  stbi__refill_buffer(psVar34);
                  pbVar33 = psVar34->img_buffer;
                  goto LAB_0011c576;
                }
                uVar36 = 0;
              }
              psVar34 = z->s;
              pbVar33 = psVar34->img_buffer;
              if (pbVar33 < psVar34->img_buffer_end) {
LAB_0011c5b2:
                psVar34->img_buffer = pbVar33 + 1;
                bVar8 = *pbVar33;
              }
              else {
                if (psVar34->read_from_callbacks != 0) {
                  stbi__refill_buffer(psVar34);
                  pbVar33 = psVar34->img_buffer;
                  goto LAB_0011c5b2;
                }
                bVar8 = 0;
              }
              uVar23 = z->s->img_n;
              if ((int)uVar23 < 1) {
                uVar39 = 0;
              }
              else {
                uVar39 = 0;
                paVar29 = paVar1;
                do {
                  if (paVar29->id == uVar36) goto LAB_0011c5e5;
                  uVar39 = uVar39 + 1;
                  paVar29 = paVar29 + 1;
                } while (uVar23 != uVar39);
                uVar39 = (ulong)uVar23;
              }
LAB_0011c5e5:
              if ((uint)uVar39 == uVar23) goto LAB_0011e38f;
              uVar35 = uVar39 & 0xffffffff;
              paVar29 = (anon_struct_96_18_0d0905d3 *)(uVar35 * 0x60);
              z->img_comp[uVar35].hd = (uint)(bVar8 >> 4);
              if (0x3f < bVar8) {
                pcVar16 = "bad DC huff";
                goto LAB_0011e386;
              }
              paVar29 = paVar1 + uVar35;
              paVar29->ha = bVar8 & 0xf;
              if (3 < (bVar8 & 0xf)) {
                pcVar16 = "bad AC huff";
                goto LAB_0011e386;
              }
              z->order[lVar17] = (uint)uVar39;
              lVar17 = lVar17 + 1;
            } while (lVar17 < z->scan_n);
          }
          psVar34 = z->s;
          pbVar33 = psVar34->img_buffer;
          if (pbVar33 < psVar34->img_buffer_end) {
LAB_0011c698:
            psVar34->img_buffer = pbVar33 + 1;
            uVar23 = (uint)*pbVar33;
          }
          else {
            if (psVar34->read_from_callbacks != 0) {
              stbi__refill_buffer(psVar34);
              pbVar33 = psVar34->img_buffer;
              goto LAB_0011c698;
            }
            uVar23 = 0;
          }
          z->spec_start = uVar23;
          psVar34 = z->s;
          pbVar33 = psVar34->img_buffer;
          if (pbVar33 < psVar34->img_buffer_end) {
LAB_0011c6db:
            psVar34->img_buffer = pbVar33 + 1;
            uVar23 = (uint)*pbVar33;
          }
          else {
            if (psVar34->read_from_callbacks != 0) {
              stbi__refill_buffer(psVar34);
              pbVar33 = psVar34->img_buffer;
              goto LAB_0011c6db;
            }
            uVar23 = 0;
          }
          z->spec_end = uVar23;
          psVar34 = z->s;
          pbVar33 = psVar34->img_buffer;
          if (pbVar33 < psVar34->img_buffer_end) {
LAB_0011c71e:
            psVar34->img_buffer = pbVar33 + 1;
            bVar8 = *pbVar33;
          }
          else {
            if (psVar34->read_from_callbacks != 0) {
              stbi__refill_buffer(psVar34);
              pbVar33 = psVar34->img_buffer;
              goto LAB_0011c71e;
            }
            bVar8 = 0;
          }
          z->succ_high = (uint)(bVar8 >> 4);
          uVar23 = bVar8 & 0xf;
          paVar29 = (anon_struct_96_18_0d0905d3 *)(ulong)uVar23;
          z->succ_low = uVar23;
          iVar11 = z->progressive;
          iVar15 = z->spec_start;
          if (iVar11 == 0) {
            if (((iVar15 != 0) || (0xf < bVar8)) || ((bVar8 & 0xf) != 0)) goto LAB_0011d9c6;
            z->spec_end = 0x3f;
          }
          else if (((0x3f < iVar15) || (0x3f < z->spec_end)) ||
                  ((z->spec_end < iVar15 || ((0xdf < bVar8 || (0xd < uVar23)))))) {
LAB_0011d9c6:
            pcVar16 = "bad SOS";
            goto LAB_0011e386;
          }
          iVar15 = z->scan_n;
          uVar39 = (ulong)(uint)z->restart_interval;
          if (z->restart_interval == 0) {
            uVar39 = 0x7fffffff;
          }
          z->code_buffer = 0;
          z->code_bits = 0;
          z->nomore = 0;
          z->img_comp[3].dc_pred = 0;
          z->img_comp[2].dc_pred = 0;
          z->img_comp[1].dc_pred = 0;
          z->img_comp[0].dc_pred = 0;
          z->marker = 0xff;
          uVar23 = (uint)uVar39;
          z->todo = uVar23;
          z->eob_run = 0;
          if (iVar11 == 0) {
            if (iVar15 == 1) {
              iVar15 = z->order[0];
              iVar40 = z->img_comp[iVar15].y + 7 >> 3;
              if (0 < iVar40) {
                uVar36 = paVar1[iVar15].x + 7 >> 3;
                local_188 = (ulong)uVar36;
                iVar13 = 0;
                iVar22 = 0;
                do {
                  if (0 < (int)uVar36) {
                    lVar17 = 0;
                    do {
                      iVar11 = stbi__jpeg_decode_block
                                         (z,local_f8,z->huff_dc + paVar1[iVar15].hd,
                                          z->huff_ac + paVar1[iVar15].ha,
                                          z->fast_ac[paVar1[iVar15].ha],iVar15,
                                          z->dequant[paVar1[iVar15].tq]);
                      if (iVar11 == 0) {
                        bVar44 = false;
                        local_1bc = 0;
                        uVar39 = extraout_RDX_07;
                      }
                      else {
                        (*z->idct_block_kernel)
                                  (paVar1[iVar15].data + lVar17 + iVar13 * paVar1[iVar15].w2,
                                   paVar1[iVar15].w2,local_f8);
                        iVar11 = z->todo;
                        z->todo = iVar11 + -1;
                        bVar44 = true;
                        uVar39 = extraout_RDX_08;
                        if (iVar11 < 2) {
                          if (z->code_bits < 0x18) {
                            stbi__grow_buffer_unsafe(z);
                            uVar39 = extraout_RDX_09;
                          }
                          if ((z->marker & 0xf8) == 0xd0) {
                            z->code_buffer = 0;
                            z->code_bits = 0;
                            z->nomore = 0;
                            z->img_comp[3].dc_pred = 0;
                            z->img_comp[2].dc_pred = 0;
                            z->img_comp[1].dc_pred = 0;
                            z->img_comp[0].dc_pred = 0;
                            z->marker = 0xff;
                            iVar11 = z->restart_interval;
                            uVar39 = 0x7fffffff;
                            if (iVar11 == 0) {
                              iVar11 = 0x7fffffff;
                            }
                            z->todo = iVar11;
                            z->eob_run = 0;
                          }
                          else {
                            local_1bc = 1;
                            bVar44 = false;
                          }
                        }
                      }
                      uVar23 = (uint)uVar39;
                      iVar11 = local_1bc;
                      if (!bVar44) goto LAB_0011d84f;
                      lVar17 = lVar17 + 8;
                    } while (local_188 * 8 != lVar17);
                  }
                  uVar23 = (uint)uVar39;
                  iVar22 = iVar22 + 1;
                  iVar13 = iVar13 + 8;
                } while (iVar22 != iVar40);
              }
LAB_0011d5be:
              iVar11 = 1;
            }
            else {
              iVar11 = 1;
              if (0 < z->img_mcu_y) {
                iVar15 = 0;
                do {
                  if (0 < z->img_mcu_x) {
                    local_1bc = 0;
                    do {
                      if (0 < z->scan_n) {
                        lVar17 = 0;
                        do {
                          iVar11 = z->order[lVar17];
                          if (0 < z->img_comp[iVar11].v) {
                            iVar40 = 0;
                            bVar44 = true;
                            do {
                              local_188 = CONCAT71(local_188._1_7_,bVar44);
                              iVar22 = paVar1[iVar11].h;
                              if (0 < iVar22) {
                                iVar13 = 0;
                                do {
                                  iVar42 = paVar1[iVar11].v;
                                  iVar14 = stbi__jpeg_decode_block
                                                     (z,local_f8,z->huff_dc + paVar1[iVar11].hd,
                                                      z->huff_ac + paVar1[iVar11].ha,
                                                      z->fast_ac[paVar1[iVar11].ha],iVar11,
                                                      z->dequant[paVar1[iVar11].tq]);
                                  uVar23 = (uint)extraout_RDX_11;
                                  if (iVar14 == 0) {
                                    uVar39 = extraout_RDX_11;
                                    if (bVar44 != false) goto LAB_0011d82f;
                                    goto LAB_0011d736;
                                  }
                                  (*z->idct_block_kernel)
                                            (paVar1[iVar11].data +
                                             (long)((iVar22 * local_1bc + iVar13) * 8) +
                                             (long)((iVar42 * iVar15 + iVar40) * paVar1[iVar11].w2 *
                                                   8),paVar1[iVar11].w2,local_f8);
                                  iVar13 = iVar13 + 1;
                                  iVar22 = paVar1[iVar11].h;
                                  uVar39 = extraout_RDX_12;
                                } while (iVar13 < iVar22);
                              }
                              iVar40 = iVar40 + 1;
                              bVar44 = iVar40 < paVar1[iVar11].v;
                            } while (iVar40 < paVar1[iVar11].v);
                          }
LAB_0011d736:
                          lVar17 = lVar17 + 1;
                        } while (lVar17 < z->scan_n);
                      }
                      uVar23 = (uint)uVar39;
                      iVar11 = z->todo;
                      z->todo = iVar11 + -1;
                      if (iVar11 < 2) {
                        if (z->code_bits < 0x18) {
                          stbi__grow_buffer_unsafe(z);
                          uVar23 = extraout_EDX_02;
                        }
                        iVar11 = 1;
                        if ((z->marker & 0xf8) != 0xd0) goto LAB_0011d84f;
                        z->code_buffer = 0;
                        z->code_bits = 0;
                        z->nomore = 0;
                        z->img_comp[3].dc_pred = 0;
                        z->img_comp[2].dc_pred = 0;
                        z->img_comp[1].dc_pred = 0;
                        z->img_comp[0].dc_pred = 0;
                        z->marker = 0xff;
                        iVar11 = z->restart_interval;
                        uVar39 = 0x7fffffff;
                        if (iVar11 == 0) {
                          iVar11 = 0x7fffffff;
                        }
                        z->todo = iVar11;
                        z->eob_run = 0;
                      }
                      local_1bc = local_1bc + 1;
                    } while (local_1bc < z->img_mcu_x);
                  }
                  uVar23 = (uint)uVar39;
                  iVar15 = iVar15 + 1;
                  iVar11 = 1;
                } while (iVar15 < z->img_mcu_y);
              }
            }
          }
          else if (iVar15 == 1) {
            local_108 = (long)z->order[0];
            local_124 = z->img_comp[local_108].y + 7 >> 3;
            iVar11 = 1;
            if (0 < local_124) {
              paVar29 = paVar1 + local_108;
              local_128 = z->img_comp[local_108].x + 7 >> 3;
              iVar15 = 0;
              local_130 = paVar29;
              do {
                if (0 < local_128) {
                  iVar11 = 0;
                  do {
                    local_1bc = iVar11;
                    piVar7 = local_120;
                    psVar43 = paVar29->coeff + (paVar29->coeff_w * iVar15 + local_1bc) * 0x40;
                    uVar35 = (ulong)z->spec_start;
                    if (uVar35 == 0) {
                      iVar11 = stbi__jpeg_decode_block_prog_dc
                                         (z,psVar43,z->huff_dc + paVar29->hd,(int)local_108);
                      uVar39 = extraout_RDX_05;
                      if (iVar11 != 0) goto LAB_0011cdab;
                      bVar44 = false;
                      local_188 = 0;
                    }
                    else {
                      lVar17 = (long)paVar29->ha;
                      iVar11 = z->eob_run;
                      bVar8 = (byte)z->succ_low;
                      if (z->succ_high == 0) {
                        if (iVar11 == 0) {
                          do {
                            if (z->code_bits < 0x10) {
                              stbi__grow_buffer_unsafe(z);
                            }
                            sVar10 = z->fast_ac[lVar17][z->code_buffer >> 0x17];
                            uVar23 = (uint)sVar10;
                            iVar11 = (int)uVar35;
                            if (sVar10 == 0) {
                              if (z->code_bits < 0x10) {
                                stbi__grow_buffer_unsafe(z);
                              }
                              uVar23 = z->code_buffer;
                              uVar39 = (ulong)z->huff_ac[lVar17].fast[uVar23 >> 0x17];
                              if (uVar39 == 0xff) {
                                lVar24 = 0;
                                do {
                                  lVar37 = lVar24;
                                  lVar24 = lVar37 + 1;
                                } while ((uint)piVar7[lVar17 * 0x1a4 + lVar37 + -0x11] <=
                                         uVar23 >> 0x10);
                                iVar40 = z->code_bits;
                                if (lVar24 == 8) {
                                  z->code_bits = iVar40 + -0x10;
                                  uVar36 = 0xffffffff;
                                }
                                else {
                                  uVar36 = 0xffffffff;
                                  if (((int)(lVar37 + 10) <= iVar40) &&
                                     (uVar26 = (uVar23 >> (0x17U - (char)lVar24 & 0x1f) &
                                               stbi__bmask[lVar37 + 10]) +
                                               piVar7[lVar17 * 0x1a4 + lVar24], uVar26 < 0x100)) {
                                    bVar2 = z->huff_ac[lVar17].size[uVar26];
                                    if ((uVar23 >> (-bVar2 & 0x1f) & stbi__bmask[bVar2]) !=
                                        (uint)z->huff_ac[lVar17].code[uVar26]) goto LAB_0011e3e5;
                                    z->code_bits = (iVar40 - (int)lVar24) + -9;
                                    z->code_buffer = uVar23 << ((byte)(lVar37 + 10) & 0x1f);
                                    uVar36 = (uint)z->huff_ac[lVar17].values[uVar26];
                                  }
                                }
                              }
                              else {
                                bVar2 = z->huff_ac[lVar17].size[uVar39];
                                uVar36 = 0xffffffff;
                                if ((int)(uint)bVar2 <= z->code_bits) {
                                  z->code_buffer = uVar23 << (bVar2 & 0x1f);
                                  z->code_bits = z->code_bits - (uint)bVar2;
                                  uVar36 = (uint)z->huff_ac[lVar17].values[uVar39];
                                }
                              }
                              if ((int)uVar36 < 0) {
                                *(char **)(in_FS_OFFSET + -0x20) = "bad huffman code";
                                iVar11 = 1;
                                bVar44 = false;
                              }
                              else {
                                uVar23 = uVar36 >> 4;
                                uVar26 = uVar36 & 0xf;
                                if ((uVar36 & 0xf) == 0) {
                                  if (uVar36 < 0xf0) {
                                    z->eob_run = 1 << ((byte)uVar23 & 0x1f);
                                    if (0xf < uVar36) {
                                      if (z->code_bits < (int)uVar23) {
                                        stbi__grow_buffer_unsafe(z);
                                      }
                                      uVar36 = 0;
                                      if ((int)uVar23 <= z->code_bits) {
                                        bVar2 = (byte)uVar23 & 0x1f;
                                        uVar36 = z->code_buffer << bVar2 |
                                                 z->code_buffer >> 0x20 - bVar2;
                                        uVar26 = stbi__bmask[uVar23];
                                        z->code_buffer = ~uVar26 & uVar36;
                                        uVar36 = uVar36 & uVar26;
                                        z->code_bits = z->code_bits - uVar23;
                                      }
                                      z->eob_run = z->eob_run + uVar36;
                                    }
                                    z->eob_run = z->eob_run + -1;
                                    iVar11 = 2;
                                    goto LAB_0011cf0b;
                                  }
                                  uVar23 = iVar11 + 0x10;
                                }
                                else {
                                  bVar2 = ""[(long)iVar11 + (ulong)uVar23];
                                  if (z->code_bits < (int)uVar26) {
                                    stbi__grow_buffer_unsafe(z);
                                  }
                                  iVar40 = 0;
                                  if ((int)uVar26 <= z->code_bits) {
                                    uVar36 = z->code_buffer;
                                    uVar27 = uVar36 << (sbyte)uVar26 |
                                             uVar36 >> 0x20 - (sbyte)uVar26;
                                    uVar41 = *(uint *)((long)stbi__bmask + (ulong)(uVar26 << 2));
                                    z->code_buffer = ~uVar41 & uVar27;
                                    z->code_bits = z->code_bits - uVar26;
                                    iVar40 = 0;
                                    if (-1 < (int)uVar36) {
                                      iVar40 = *(int *)((long)stbi__jbias + (ulong)(uVar26 << 2));
                                    }
                                    iVar40 = (uVar27 & uVar41) + iVar40;
                                  }
                                  uVar23 = (int)((long)iVar11 + (ulong)uVar23) + 1;
                                  psVar43[bVar2] = (short)(iVar40 << (bVar8 & 0x1f));
                                }
                                uVar35 = (ulong)uVar23;
                                iVar11 = 0;
                                bVar44 = true;
                              }
                            }
                            else {
                              uVar26 = iVar11 + (uVar23 >> 4 & 0xf);
                              uVar35 = (ulong)uVar26;
                              uVar36 = uVar23 & 0xf;
                              if (z->code_bits < (int)uVar36) {
                                *(char **)(in_FS_OFFSET + -0x20) = "bad huffman code";
                                iVar11 = 1;
LAB_0011cf0b:
                                bVar44 = false;
                              }
                              else {
                                z->code_buffer = z->code_buffer << (sbyte)uVar36;
                                z->code_bits = z->code_bits - uVar36;
                                uVar35 = (ulong)(uVar26 + 1);
                                psVar43[""[(int)uVar26]] = (short)((uVar23 >> 8) << (bVar8 & 0x1f));
                                iVar11 = 0 << (bVar8 & 0x1f);
                                bVar44 = true;
                              }
                            }
                            uVar39 = 0;
                            bVar6 = true;
                            if (iVar11 != 0) {
                              if (iVar11 != 2) {
                                bVar6 = bVar44;
                              }
                              break;
                            }
                          } while ((int)uVar35 <= z->spec_end);
                        }
                        else {
                          z->eob_run = iVar11 + -1;
                          uVar39 = 1;
                          bVar6 = false;
                        }
                        if (bVar6) goto LAB_0011cd83;
                      }
                      else {
                        if (iVar11 == 0) {
                          iVar11 = 0x10000 << (bVar8 & 0x1f);
                          uVar23 = iVar11 >> 0x10;
                          do {
                            if (z->code_bits < 0x10) {
                              stbi__grow_buffer_unsafe(z);
                            }
                            uVar36 = z->code_buffer;
                            uVar39 = (ulong)z->huff_ac[lVar17].fast[uVar36 >> 0x17];
                            if (uVar39 == 0xff) {
                              lVar24 = 0;
                              do {
                                lVar37 = lVar24;
                                lVar24 = lVar37 + 1;
                              } while ((uint)piVar7[lVar17 * 0x1a4 + lVar37 + -0x11] <=
                                       uVar36 >> 0x10);
                              iVar40 = z->code_bits;
                              if (lVar24 == 8) {
                                z->code_bits = iVar40 + -0x10;
                                uVar26 = 0xffffffff;
                              }
                              else {
                                uVar26 = 0xffffffff;
                                if (((int)(lVar37 + 10) <= iVar40) &&
                                   (uVar41 = (uVar36 >> (0x17U - (char)lVar24 & 0x1f) &
                                             stbi__bmask[lVar37 + 10]) +
                                             piVar7[lVar17 * 0x1a4 + lVar24], uVar41 < 0x100)) {
                                  bVar8 = z->huff_ac[lVar17].size[uVar41];
                                  if ((uVar36 >> (-bVar8 & 0x1f) & stbi__bmask[bVar8]) !=
                                      (uint)z->huff_ac[lVar17].code[uVar41]) {
LAB_0011e3e5:
                                    __assert_fail("(((j->code_buffer) >> (32 - h->size[c])) & stbi__bmask[h->size[c]]) == h->code[c]"
                                                  ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/deps/stb/stb_image.h"
                                                  ,0x85a,
                                                  "int stbi__jpeg_huff_decode(stbi__jpeg *, stbi__huffman *)"
                                                 );
                                  }
                                  z->code_bits = (iVar40 - (int)lVar24) + -9;
                                  z->code_buffer = uVar36 << ((byte)(lVar37 + 10) & 0x1f);
                                  uVar26 = (uint)z->huff_ac[lVar17].values[uVar41];
                                }
                              }
                            }
                            else {
                              bVar8 = z->huff_ac[lVar17].size[uVar39];
                              uVar26 = 0xffffffff;
                              if ((int)(uint)bVar8 <= z->code_bits) {
                                z->code_buffer = uVar36 << (bVar8 & 0x1f);
                                z->code_bits = z->code_bits - (uint)bVar8;
                                uVar26 = (uint)z->huff_ac[lVar17].values[uVar39];
                              }
                            }
                            if ((int)uVar26 < 0) {
                              *(char **)(in_FS_OFFSET + -0x20) = "bad huffman code";
                              bVar44 = false;
                            }
                            else {
                              uVar36 = uVar26 >> 4;
                              if ((uVar26 & 0xf) == 1) {
                                if (z->code_bits < 1) {
                                  stbi__grow_buffer_unsafe(z);
                                }
                                uVar26 = -uVar23;
                                if (0 < z->code_bits) {
                                  sVar12 = z->code_buffer;
                                  z->code_buffer = sVar12 * 2;
                                  z->code_bits = z->code_bits + -1;
                                  if ((int)sVar12 < 0) {
                                    uVar26 = uVar23;
                                  }
                                }
                                sVar10 = (short)uVar26;
                                uVar41 = uVar36;
                              }
                              else {
                                if ((uVar26 & 0xf) != 0) {
                                  *(char **)(in_FS_OFFSET + -0x20) = "bad huffman code";
                                  bVar44 = false;
                                  goto LAB_0011cd6e;
                                }
                                sVar10 = 0;
                                uVar41 = 0xf;
                                if (uVar26 < 0xf0) {
                                  z->eob_run = ~(-1 << ((byte)uVar36 & 0x1f));
                                  uVar41 = 0x40;
                                  sVar10 = 0;
                                  if (0xf < uVar26) {
                                    if (z->code_bits < (int)uVar36) {
                                      stbi__grow_buffer_unsafe(z);
                                    }
                                    sVar10 = 0;
                                    uVar26 = 0;
                                    if ((int)uVar36 <= z->code_bits) {
                                      bVar8 = (byte)uVar36 & 0x1f;
                                      uVar26 = z->code_buffer << bVar8 |
                                               z->code_buffer >> 0x20 - bVar8;
                                      uVar27 = stbi__bmask[uVar36];
                                      z->code_buffer = ~uVar27 & uVar26;
                                      uVar26 = uVar26 & uVar27;
                                      z->code_bits = z->code_bits - uVar36;
                                    }
                                    z->eob_run = z->eob_run + uVar26;
                                  }
                                }
                              }
                              uVar35 = (ulong)(int)uVar35;
                              do {
                                if ((long)z->spec_end < (long)uVar35) break;
                                bVar8 = ""[uVar35];
                                if (psVar43[bVar8] == 0) {
                                  if (uVar41 == 0) {
                                    psVar43[bVar8] = sVar10;
                                    bVar44 = false;
                                    uVar41 = 0;
                                  }
                                  else {
                                    uVar41 = uVar41 - 1;
                                    bVar44 = true;
                                  }
                                }
                                else {
                                  if (z->code_bits < 1) {
                                    stbi__grow_buffer_unsafe(z);
                                  }
                                  bVar44 = true;
                                  if (0 < z->code_bits) {
                                    sVar12 = z->code_buffer;
                                    z->code_buffer = sVar12 * 2;
                                    z->code_bits = z->code_bits + -1;
                                    if (((int)sVar12 < 0) &&
                                       (sVar4 = psVar43[bVar8], (uVar23 & (int)sVar4) == 0)) {
                                      sVar5 = (short)((uint)iVar11 >> 0x10);
                                      if (sVar4 < 1) {
                                        sVar5 = -sVar5;
                                      }
                                      psVar43[bVar8] = sVar4 + sVar5;
                                    }
                                  }
                                }
                                uVar35 = uVar35 + 1;
                              } while (bVar44);
                              bVar44 = true;
                            }
LAB_0011cd6e:
                            if (!bVar44) {
                              uVar39 = 0;
                              goto LAB_0011cd88;
                            }
                          } while ((int)uVar35 <= z->spec_end);
                        }
                        else {
                          z->eob_run = iVar11 + -1;
                          if (z->spec_start <= z->spec_end) {
                            uVar23 = (0x10000 << (bVar8 & 0x1f)) >> 0x10;
                            do {
                              bVar8 = ""[uVar35];
                              if (psVar43[bVar8] != 0) {
                                if (z->code_bits < 1) {
                                  stbi__grow_buffer_unsafe(z);
                                }
                                if (0 < z->code_bits) {
                                  sVar12 = z->code_buffer;
                                  z->code_buffer = sVar12 * 2;
                                  z->code_bits = z->code_bits + -1;
                                  if (((int)sVar12 < 0) &&
                                     (sVar10 = psVar43[bVar8], (uVar23 & (int)sVar10) == 0)) {
                                    uVar36 = -uVar23;
                                    if (0 < sVar10) {
                                      uVar36 = uVar23;
                                    }
                                    psVar43[bVar8] = (short)uVar36 + sVar10;
                                  }
                                }
                              }
                              bVar44 = (long)uVar35 < (long)z->spec_end;
                              uVar35 = uVar35 + 1;
                            } while (bVar44);
                          }
                        }
LAB_0011cd83:
                        uVar39 = 1;
                      }
LAB_0011cd88:
                      bVar44 = (int)uVar39 == 0;
                      if (bVar44) {
                        local_188._0_4_ = 0;
                      }
                      local_188 = (ulong)(uint)local_188;
                      if (bVar44) {
                        bVar44 = false;
                      }
                      else {
LAB_0011cdab:
                        iVar11 = z->todo;
                        z->todo = iVar11 + -1;
                        bVar44 = true;
                        if (iVar11 < 2) {
                          if (z->code_bits < 0x18) {
                            stbi__grow_buffer_unsafe(z);
                            uVar39 = extraout_RDX_06;
                          }
                          if ((z->marker & 0xf8) == 0xd0) {
                            z->code_buffer = 0;
                            z->code_bits = 0;
                            z->nomore = 0;
                            z->img_comp[3].dc_pred = 0;
                            z->img_comp[2].dc_pred = 0;
                            z->img_comp[1].dc_pred = 0;
                            z->img_comp[0].dc_pred = 0;
                            z->marker = 0xff;
                            iVar11 = z->restart_interval;
                            uVar39 = 0x7fffffff;
                            if (iVar11 == 0) {
                              iVar11 = 0x7fffffff;
                            }
                            z->todo = iVar11;
                            z->eob_run = 0;
                          }
                          else {
                            local_188 = 1;
                            bVar44 = false;
                          }
                        }
                      }
                    }
                    uVar23 = (uint)uVar39;
                    if (!bVar44) {
                      iVar11 = (int)local_188;
                      goto LAB_0011d84f;
                    }
                    paVar29 = local_130;
                    iVar11 = local_1bc + 1;
                  } while (local_1bc + 1 != local_128);
                }
                uVar23 = (uint)uVar39;
                iVar11 = 1;
                iVar15 = iVar15 + 1;
              } while (iVar15 != local_124);
            }
          }
          else {
            iVar11 = 1;
            if (0 < z->img_mcu_y) {
              iVar11 = 0;
              do {
                if (0 < z->img_mcu_x) {
                  iVar15 = 0;
                  do {
                    if (0 < z->scan_n) {
                      lVar17 = 0;
                      do {
                        iVar40 = z->order[lVar17];
                        if (0 < z->img_comp[iVar40].v) {
                          iVar22 = 0;
                          bVar44 = true;
                          do {
                            iVar13 = paVar1[iVar40].h;
                            if (0 < iVar13) {
                              iVar42 = 0;
                              do {
                                iVar13 = stbi__jpeg_decode_block_prog_dc
                                                   (z,paVar1[iVar40].coeff +
                                                      (iVar13 * iVar15 + iVar42 +
                                                      (paVar1[iVar40].v * iVar11 + iVar22) *
                                                      paVar1[iVar40].coeff_w) * 0x40,
                                                    z->huff_dc + paVar1[iVar40].hd,iVar40);
                                uVar23 = (uint)extraout_RDX_10;
                                uVar39 = extraout_RDX_10;
                                if (iVar13 == 0) {
                                  if (bVar44) goto LAB_0011d82f;
                                  goto LAB_0011d4ec;
                                }
                                iVar42 = iVar42 + 1;
                                iVar13 = paVar1[iVar40].h;
                              } while (iVar42 < iVar13);
                            }
                            iVar22 = iVar22 + 1;
                            bVar44 = iVar22 < paVar1[iVar40].v;
                          } while (iVar22 < paVar1[iVar40].v);
                        }
LAB_0011d4ec:
                        lVar17 = lVar17 + 1;
                      } while (lVar17 < z->scan_n);
                    }
                    uVar23 = (uint)uVar39;
                    iVar40 = z->todo;
                    z->todo = iVar40 + -1;
                    if (iVar40 < 2) {
                      if (z->code_bits < 0x18) {
                        stbi__grow_buffer_unsafe(z);
                        uVar23 = extraout_EDX_01;
                      }
                      if ((z->marker & 0xf8) != 0xd0) goto LAB_0011d5be;
                      z->code_buffer = 0;
                      z->code_bits = 0;
                      z->nomore = 0;
                      z->img_comp[3].dc_pred = 0;
                      z->img_comp[2].dc_pred = 0;
                      z->img_comp[1].dc_pred = 0;
                      z->img_comp[0].dc_pred = 0;
                      z->marker = 0xff;
                      iVar40 = z->restart_interval;
                      uVar39 = 0x7fffffff;
                      if (iVar40 == 0) {
                        iVar40 = 0x7fffffff;
                      }
                      z->todo = iVar40;
                      z->eob_run = 0;
                    }
                    iVar15 = iVar15 + 1;
                  } while (iVar15 < z->img_mcu_x);
                }
                uVar23 = (uint)uVar39;
                iVar11 = iVar11 + 1;
              } while (iVar11 < z->img_mcu_y);
              goto LAB_0011d5be;
            }
          }
          goto LAB_0011d84f;
        }
        pcVar16 = "bad SOS component count";
LAB_0011e386:
        uVar23 = (uint)paVar29;
        *(char **)(in_FS_OFFSET + -0x20) = pcVar16;
        goto LAB_0011e38f;
      }
      if (uVar36 == 0xdc) goto LAB_0011c482;
      if (uVar36 == 0xd9) {
        if ((z->progressive != 0) && (0 < z->s->img_n)) {
          lVar17 = 0;
          do {
            iVar11 = z->img_comp[lVar17].y + 7 >> 3;
            if (0 < iVar11) {
              uVar23 = paVar1[lVar17].x + 7 >> 3;
              iVar15 = 0;
              do {
                if (0 < (int)uVar23) {
                  uVar39 = 0;
                  do {
                    psVar43 = paVar1[lVar17].coeff +
                              (paVar1[lVar17].coeff_w * iVar15 + (int)uVar39) * 0x40;
                    iVar40 = paVar1[lVar17].tq;
                    lVar24 = 0;
                    do {
                      psVar43[lVar24] = psVar43[lVar24] * z->dequant[iVar40][lVar24];
                      lVar24 = lVar24 + 1;
                    } while (lVar24 != 0x40);
                    (*z->idct_block_kernel)
                              (paVar1[lVar17].data +
                               uVar39 * 8 + (long)(iVar15 * 8 * paVar1[lVar17].w2),paVar1[lVar17].w2
                               ,psVar43);
                    uVar39 = uVar39 + 1;
                    uVar28 = extraout_RDX_14;
                  } while (uVar39 != uVar23);
                }
                iVar15 = iVar15 + 1;
              } while (iVar15 != iVar11);
            }
            uVar23 = (uint)uVar28;
            lVar17 = lVar17 + 1;
          } while (lVar17 < z->s->img_n);
        }
      }
      else {
        iVar11 = stbi__process_marker(z,uVar36);
        uVar23 = extraout_EDX_00;
        if (iVar11 != 0) goto LAB_0011c475;
      }
      if (req_comp == 0) {
        req_comp = (uint)(2 < z->s->img_n) * 2 + 1;
      }
      uVar36 = z->s->img_n;
      if (uVar36 == 3) {
        bVar44 = true;
        if (z->rgb != 3) {
          if (z->app14_color_transform != 0) goto LAB_0011db07;
          bVar44 = z->jfif == 0;
        }
      }
      else {
LAB_0011db07:
        bVar44 = false;
      }
      uVar26 = 1;
      if (bVar44) {
        uVar26 = uVar36;
      }
      if (2 < req_comp) {
        uVar26 = uVar36;
      }
      if (uVar36 != 3) {
        uVar26 = uVar36;
      }
      if (0 < (int)uVar26) {
        local_158[2] = (stbi_uc *)0x0;
        local_158[3] = (stbi_uc *)0x0;
        local_158[0] = (stbi_uc *)0x0;
        local_158[1] = (stbi_uc *)0x0;
        pvVar20 = (void *)0x0;
        lVar17 = 0;
        do {
          psVar34 = z->s;
          sVar12 = psVar34->img_x;
          pvVar18 = malloc((ulong)(sVar12 + 3));
          *(void **)((long)&z->img_comp[0].linebuf + lVar17 * 2) = pvVar18;
          if (pvVar18 == (void *)0x0) {
            stbi__free_jpeg_components(z,psVar34->img_n,why);
            *(char **)(in_FS_OFFSET + -0x20) = "outofmem";
          }
          else {
            uVar39 = (long)z->img_h_max / (long)*(int *)((long)&z->img_comp[0].h + lVar17 * 2);
            iVar11 = (int)uVar39;
            *(int *)((long)local_e0 + lVar17) = iVar11;
            iVar15 = z->img_v_max / *(int *)((long)&z->img_comp[0].v + lVar17 * 2);
            *(int *)((long)local_e0 + lVar17 + 4) = iVar15;
            *(int *)((long)local_e0 + lVar17 + 0xc) = iVar15 >> 1;
            *(int *)((long)local_e0 + lVar17 + 8) =
                 (int)((ulong)((sVar12 + iVar11) - 1) / (uVar39 & 0xffffffff));
            *(undefined4 *)((long)local_e0 + lVar17 + 0x10) = 0;
            uVar28 = *(undefined8 *)((long)&z->img_comp[0].data + lVar17 * 2);
            *(undefined8 *)((long)local_f0 + lVar17 + 8) = uVar28;
            *(undefined8 *)((long)local_f0 + lVar17) = uVar28;
            if ((iVar11 == 1) && (iVar15 == 1)) {
              *(code **)((long)local_f8 + lVar17) = resample_row_1;
            }
            else {
              if ((iVar11 == 1) && (iVar15 == 2)) {
                pcVar19 = stbi__resample_row_v_2;
              }
              else if ((iVar11 == 2) && (iVar15 == 1)) {
                pcVar19 = stbi__resample_row_h_2;
              }
              else if ((iVar11 == 2) && (iVar15 == 2)) {
                pcVar19 = z->resample_row_hv_2_kernel;
              }
              else {
                pcVar19 = stbi__resample_row_generic;
              }
              *(code **)((long)local_f8 + lVar17) = pcVar19;
            }
          }
          if (pvVar18 == (void *)0x0) goto LAB_0011e3a1;
          lVar17 = lVar17 + 0x30;
        } while ((ulong)uVar26 * 0x30 != lVar17);
        psVar34 = z->s;
        sVar12 = psVar34->img_y;
        pvVar20 = stbi__malloc_mad3(req_comp,psVar34->img_x,sVar12,1);
        if (pvVar20 != (void *)0x0) {
          iVar11 = why_00;
          if (sVar12 != 0) {
            iVar15 = 0;
            uVar23 = 0;
            do {
              sVar12 = psVar34->img_x;
              ppsVar31 = local_158;
              lVar17 = 0;
              do {
                puVar21 = (undefined8 *)((long)local_f0 + lVar17 + 8);
                iVar11 = *(int *)((long)local_e0 + lVar17 + 0xc);
                iVar40 = *(int *)((long)local_e0 + lVar17 + 4);
                iVar22 = iVar40 >> 1;
                puVar25 = puVar21;
                if (iVar11 < iVar22) {
                  puVar25 = (undefined8 *)((long)local_f0 + lVar17);
                }
                if (iVar22 <= iVar11) {
                  puVar21 = (undefined8 *)((long)local_f0 + lVar17);
                }
                auVar45 = (**(code **)((long)local_f8 + lVar17))
                                    (*(undefined8 *)((long)&z->img_comp[0].linebuf + lVar17 * 2),
                                     *puVar25,*puVar21,*(undefined4 *)((long)local_e0 + lVar17 + 8))
                ;
                psVar30 = auVar45._8_8_;
                *ppsVar31 = auVar45._0_8_;
                *(int *)((long)local_e0 + lVar17 + 0xc) = iVar11 + 1;
                if (iVar40 <= iVar11 + 1) {
                  *(undefined4 *)((long)local_e0 + lVar17 + 0xc) = 0;
                  lVar24 = *(long *)((long)local_f0 + lVar17 + 8);
                  *(long *)((long)local_f0 + lVar17) = lVar24;
                  iVar11 = *(int *)((long)local_e0 + lVar17 + 0x10) + 1;
                  *(int *)((long)local_e0 + lVar17 + 0x10) = iVar11;
                  if (iVar11 < *(int *)((long)&z->img_comp[0].y + lVar17 * 2)) {
                    *(long *)((long)local_f0 + lVar17 + 8) =
                         lVar24 + *(int *)((long)&z->img_comp[0].w2 + lVar17 * 2);
                  }
                }
                lVar17 = lVar17 + 0x30;
                ppsVar31 = ppsVar31 + 1;
              } while ((ulong)uVar26 * 0x30 != lVar17);
              if (req_comp < 3) {
                psVar34 = z->s;
                if (bVar44) {
                  if (req_comp == 1) {
                    if (psVar34->img_x != 0) {
                      uVar39 = 0;
                      do {
                        bVar8 = local_158[2][uVar39];
                        *(char *)((long)pvVar20 + uVar39 + sVar12 * iVar15) =
                             (char)((uint)bVar8 * 2 + ((uint)bVar8 + (uint)bVar8 * 8) * 3 +
                                    (uint)local_158[1][uVar39] * 0x96 +
                                    (uint)local_158[0][uVar39] * 0x4d >> 8);
                        uVar39 = uVar39 + 1;
                        psVar30 = local_158[1];
                      } while (uVar39 < psVar34->img_x);
                    }
                  }
                  else if (psVar34->img_x != 0) {
                    uVar39 = 0;
                    do {
                      bVar8 = local_158[2][uVar39];
                      *(char *)((long)pvVar20 + uVar39 * 2 + (ulong)(sVar12 * iVar15)) =
                           (char)((uint)bVar8 * 2 + ((uint)bVar8 + (uint)bVar8 * 8) * 3 +
                                  (uint)local_158[1][uVar39] * 0x96 +
                                  (uint)local_158[0][uVar39] * 0x4d >> 8);
                      *(undefined1 *)((long)pvVar20 + uVar39 * 2 + (ulong)(sVar12 * iVar15) + 1) =
                           0xff;
                      uVar39 = uVar39 + 1;
                      psVar30 = local_158[1];
                    } while (uVar39 < psVar34->img_x);
                  }
                }
                else if (psVar34->img_n == 4) {
                  if (z->app14_color_transform == 2) {
                    if (psVar34->img_x != 0) {
                      puVar32 = (undefined1 *)((long)pvVar20 + (ulong)(sVar12 * iVar15) + 1);
                      uVar39 = 0;
                      do {
                        iVar11 = (local_158[0][uVar39] ^ 0xff) * (uint)local_158[3][uVar39];
                        puVar32[-1] = (char)((iVar11 + 0x80U >> 8) + iVar11 + 0x80 >> 8);
                        *puVar32 = 0xff;
                        uVar39 = uVar39 + 1;
                        puVar32 = puVar32 + (uint)req_comp;
                        psVar30 = local_158[3];
                      } while (uVar39 < psVar34->img_x);
                    }
                  }
                  else {
                    if (z->app14_color_transform != 0) goto LAB_0011e0c5;
                    if (psVar34->img_x != 0) {
                      puVar32 = (undefined1 *)((long)pvVar20 + (ulong)(sVar12 * iVar15) + 1);
                      uVar39 = 0;
                      do {
                        bVar8 = local_158[3][uVar39];
                        iVar11 = (uint)local_158[0][uVar39] * (uint)bVar8;
                        iVar40 = (uint)local_158[1][uVar39] * (uint)bVar8;
                        puVar32[-1] = (char)(((uint)local_158[2][uVar39] * (uint)bVar8 +
                                              ((uint)local_158[2][uVar39] * (uint)bVar8 + 0x80 >> 8)
                                              + 0x80 >> 8 & 0xff) * 0x1d +
                                             (iVar40 + (iVar40 + 0x80U >> 8) + 0x80 >> 8 & 0xff) *
                                             0x96 + (iVar11 + (iVar11 + 0x80U >> 8) + 0x80 >> 8 &
                                                    0xff) * 0x4d >> 8);
                        *puVar32 = 0xff;
                        uVar39 = uVar39 + 1;
                        puVar32 = puVar32 + (uint)req_comp;
                        psVar30 = local_158[0];
                      } while (uVar39 < psVar34->img_x);
                    }
                  }
                }
                else {
LAB_0011e0c5:
                  uVar36 = psVar34->img_x;
                  psVar30 = (stbi_uc *)(ulong)uVar36;
                  if (req_comp == 1) {
                    if (uVar36 != 0) {
                      psVar30 = (stbi_uc *)0x0;
                      do {
                        psVar30[(ulong)(sVar12 * iVar15) + (long)pvVar20] =
                             local_158[0][(long)psVar30];
                        psVar30 = psVar30 + 1;
                      } while (psVar30 < (stbi_uc *)(ulong)psVar34->img_x);
                    }
                  }
                  else if (uVar36 != 0) {
                    psVar30 = (stbi_uc *)0x0;
                    do {
                      *(stbi_uc *)((long)pvVar20 + (long)psVar30 * 2 + (ulong)(sVar12 * iVar15)) =
                           local_158[0][(long)psVar30];
                      *(undefined1 *)
                       ((long)pvVar20 + (long)psVar30 * 2 + (ulong)(sVar12 * iVar15) + 1) = 0xff;
                      psVar30 = psVar30 + 1;
                    } while (psVar30 < (stbi_uc *)(ulong)psVar34->img_x);
                  }
                }
              }
              else {
                psVar38 = (stbi_uc *)((ulong)(uVar23 * req_comp * sVar12) + (long)pvVar20);
                psVar34 = z->s;
                if (psVar34->img_n == 3) {
                  if (bVar44) {
                    if (psVar34->img_x != 0) {
                      puVar32 = (undefined1 *)((long)pvVar20 + (ulong)(sVar12 * iVar15) + 3);
                      uVar39 = 0;
                      do {
                        puVar32[-3] = local_158[0][uVar39];
                        puVar32[-2] = local_158[1][uVar39];
                        puVar32[-1] = local_158[2][uVar39];
                        *puVar32 = 0xff;
                        uVar39 = uVar39 + 1;
                        puVar32 = puVar32 + (uint)req_comp;
                        psVar30 = local_158[2];
                      } while (uVar39 < psVar34->img_x);
                    }
                  }
                  else {
LAB_0011e137:
                    (*z->YCbCr_to_RGB_kernel)
                              (psVar38,local_158[0],local_158[1],local_158[2],psVar34->img_x,
                               req_comp);
                    psVar30 = extraout_RDX_15;
                  }
                }
                else if (psVar34->img_n == 4) {
                  if (z->app14_color_transform == 2) {
                    (*z->YCbCr_to_RGB_kernel)
                              (psVar38,local_158[0],local_158[1],local_158[2],psVar34->img_x,
                               req_comp);
                    psVar34 = z->s;
                    psVar30 = extraout_RDX_16;
                    if (psVar34->img_x != 0) {
                      pbVar33 = (byte *)((long)pvVar20 + (ulong)(sVar12 * iVar15) + 2);
                      psVar30 = (stbi_uc *)0x0;
                      do {
                        bVar8 = local_158[3][(long)psVar30];
                        iVar11 = (pbVar33[-2] ^ 0xff) * (uint)bVar8;
                        pbVar33[-2] = (byte)((iVar11 + 0x80U >> 8) + iVar11 + 0x80 >> 8);
                        iVar11 = (pbVar33[-1] ^ 0xff) * (uint)bVar8;
                        pbVar33[-1] = (byte)((iVar11 + 0x80U >> 8) + iVar11 + 0x80 >> 8);
                        iVar11 = (*pbVar33 ^ 0xff) * (uint)bVar8;
                        *pbVar33 = (byte)((iVar11 + 0x80U >> 8) + iVar11 + 0x80 >> 8);
                        psVar30 = psVar30 + 1;
                        pbVar33 = pbVar33 + (uint)req_comp;
                      } while (psVar30 < (stbi_uc *)(ulong)psVar34->img_x);
                    }
                  }
                  else {
                    if (z->app14_color_transform != 0) goto LAB_0011e137;
                    if (psVar34->img_x != 0) {
                      puVar32 = (undefined1 *)((long)pvVar20 + (ulong)(sVar12 * iVar15) + 3);
                      uVar39 = 0;
                      do {
                        bVar8 = local_158[3][uVar39];
                        iVar11 = (uint)local_158[0][uVar39] * (uint)bVar8;
                        puVar32[-3] = (char)((iVar11 + 0x80U >> 8) + iVar11 + 0x80 >> 8);
                        iVar11 = (uint)local_158[1][uVar39] * (uint)bVar8;
                        puVar32[-2] = (char)((iVar11 + 0x80U >> 8) + iVar11 + 0x80 >> 8);
                        puVar32[-1] = (char)(((uint)local_158[2][uVar39] * (uint)bVar8 + 0x80 >> 8)
                                             + (uint)local_158[2][uVar39] * (uint)bVar8 + 0x80 >> 8)
                        ;
                        *puVar32 = 0xff;
                        uVar39 = uVar39 + 1;
                        puVar32 = puVar32 + (uint)req_comp;
                        psVar30 = local_158[1];
                      } while (uVar39 < psVar34->img_x);
                    }
                  }
                }
                else if (psVar34->img_x != 0) {
                  puVar32 = (undefined1 *)((long)pvVar20 + (ulong)(sVar12 * iVar15) + 3);
                  psVar38 = (stbi_uc *)0x0;
                  do {
                    sVar3 = local_158[0][(long)psVar38];
                    puVar32[-1] = sVar3;
                    puVar32[-2] = sVar3;
                    puVar32[-3] = sVar3;
                    *puVar32 = 0xff;
                    psVar38 = psVar38 + 1;
                    psVar30 = (stbi_uc *)(ulong)psVar34->img_x;
                    puVar32 = puVar32 + (uint)req_comp;
                  } while (psVar38 < psVar30);
                }
              }
              iVar11 = (int)psVar30;
              uVar23 = uVar23 + 1;
              psVar34 = z->s;
              iVar15 = iVar15 + req_comp;
            } while (uVar23 < psVar34->img_y);
          }
          stbi__free_jpeg_components(z,psVar34->img_n,iVar11);
          psVar34 = z->s;
          *local_100 = psVar34->img_x;
          *local_118 = psVar34->img_y;
          if (local_110 != (int *)0x0) {
            *local_110 = (uint)(2 < psVar34->img_n) * 2 + 1;
          }
          goto LAB_0011e3a1;
        }
        stbi__free_jpeg_components(z,psVar34->img_n,why_00);
        pcVar16 = "outofmem";
        goto LAB_0011c37d;
      }
    }
    stbi__free_jpeg_components(z,uVar36,uVar23);
  }
  else {
    pcVar16 = "bad req_comp";
LAB_0011c37d:
    *(char **)(in_FS_OFFSET + -0x20) = pcVar16;
  }
  pvVar20 = (void *)0x0;
LAB_0011e3a1:
  free(z);
  return pvVar20;
LAB_0011d82f:
  iVar11 = 0;
LAB_0011d84f:
  if (iVar11 == 0) goto LAB_0011e38f;
  paVar29 = paVar1;
  if (z->marker == 0xff) {
    do {
      psVar34 = z->s;
      if ((psVar34->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_0011d886:
        if (psVar34->img_buffer_end <= psVar34->img_buffer) {
LAB_0011d975:
          uVar9 = 0xff;
          break;
        }
      }
      else {
        iVar11 = (*(psVar34->io).eof)(psVar34->io_user_data);
        if (iVar11 != 0) {
          if (psVar34->read_from_callbacks != 0) goto LAB_0011d886;
          goto LAB_0011d975;
        }
      }
      psVar34 = z->s;
      pbVar33 = psVar34->img_buffer;
      if (pbVar33 < psVar34->img_buffer_end) {
LAB_0011d8c8:
        psVar34->img_buffer = pbVar33 + 1;
        uVar23 = (uint)*pbVar33;
      }
      else {
        if (psVar34->read_from_callbacks != 0) {
          stbi__refill_buffer(psVar34);
          pbVar33 = psVar34->img_buffer;
          goto LAB_0011d8c8;
        }
        uVar23 = 0;
      }
      do {
        uVar36 = uVar23;
        if (uVar36 != 0xff) {
          uVar23 = (uint)paVar29;
          break;
        }
        psVar34 = z->s;
        if ((psVar34->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_0011d8fc:
          if (psVar34->img_buffer_end <= psVar34->img_buffer) {
LAB_0011d954:
            uVar23 = 0xff;
            break;
          }
        }
        else {
          iVar11 = (*(psVar34->io).eof)(psVar34->io_user_data);
          if (iVar11 != 0) {
            if (psVar34->read_from_callbacks != 0) goto LAB_0011d8fc;
            goto LAB_0011d954;
          }
        }
        psVar34 = z->s;
        pbVar33 = psVar34->img_buffer;
        if (pbVar33 < psVar34->img_buffer_end) {
LAB_0011d936:
          psVar34->img_buffer = pbVar33 + 1;
          bVar8 = *pbVar33;
        }
        else {
          if (psVar34->read_from_callbacks != 0) {
            stbi__refill_buffer(psVar34);
            pbVar33 = psVar34->img_buffer;
            goto LAB_0011d936;
          }
          bVar8 = 0;
        }
        uVar23 = (uint)bVar8;
      } while (0xfd < (byte)(bVar8 - 1));
      uVar9 = (uchar)uVar23;
      paVar29 = (anon_struct_96_18_0d0905d3 *)(ulong)uVar23;
    } while (uVar36 != 0xff);
    z->marker = uVar9;
  }
  bVar8 = stbi__get_marker(z);
  uVar36 = (uint)bVar8;
  uVar28 = extraout_RDX_13;
  if ((bVar8 & 0xf8) == 0xd0) {
LAB_0011c475:
    bVar8 = stbi__get_marker(z);
    uVar36 = (uint)bVar8;
    uVar28 = extraout_RDX_00;
  }
  goto LAB_0011c449;
LAB_0011c482:
  iVar11 = stbi__get16be(z->s);
  sVar12 = stbi__get16be(z->s);
  uVar28 = extraout_RDX_01;
  if (iVar11 == 4) {
    if (sVar12 == z->s->img_y) {
      bVar8 = stbi__get_marker(z);
      uVar36 = (uint)bVar8;
      bVar44 = true;
      uVar28 = extraout_RDX_02;
    }
    else {
      *(char **)(in_FS_OFFSET + -0x20) = "bad DNL height";
      uVar36 = 0xdc;
      bVar44 = false;
    }
  }
  else {
    *(char **)(in_FS_OFFSET + -0x20) = "bad DNL len";
    uVar36 = 0xdc;
    bVar44 = false;
  }
  uVar23 = (uint)uVar28;
  if (!bVar44) goto LAB_0011e38f;
  goto LAB_0011c449;
}

Assistant:

static void *stbi__jpeg_load(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri)
{
   unsigned char* result;
   stbi__jpeg* j = (stbi__jpeg*) stbi__malloc(sizeof(stbi__jpeg));
   if (!j) return stbi__errpuc("outofmem", "Out of memory");
   memset(j, 0, sizeof(stbi__jpeg));
   STBI_NOTUSED(ri);
   j->s = s;
   stbi__setup_jpeg(j);
   result = load_jpeg_image(j, x,y,comp,req_comp);
   STBI_FREE(j);
   return result;
}